

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O1

void ExtractGreen_SSE2(uint32_t *argb,uint8_t *alpha,int size)

{
  uint8_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  uint32_t *puVar18;
  __m128i *src;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  auVar23 = _DAT_00127480;
  uVar21 = 0;
  puVar18 = argb;
  if (0xf < size) {
    uVar20 = 0;
    do {
      auVar24._0_4_ = *puVar18 >> 8;
      auVar24._4_4_ = puVar18[1] >> 8;
      auVar24._8_4_ = puVar18[2] >> 8;
      auVar24._12_4_ = puVar18[3] >> 8;
      auVar27._0_4_ = puVar18[4] >> 8;
      auVar27._4_4_ = puVar18[5] >> 8;
      auVar27._8_4_ = puVar18[6] >> 8;
      auVar27._12_4_ = puVar18[7] >> 8;
      auVar26._0_4_ = puVar18[8] >> 8;
      auVar26._4_4_ = puVar18[9] >> 8;
      auVar26._8_4_ = puVar18[10] >> 8;
      auVar26._12_4_ = puVar18[0xb] >> 8;
      auVar28._0_4_ = puVar18[0xc] >> 8;
      auVar28._4_4_ = puVar18[0xd] >> 8;
      auVar28._8_4_ = puVar18[0xe] >> 8;
      auVar28._12_4_ = puVar18[0xf] >> 8;
      auVar24 = packssdw(auVar24 & auVar23,auVar27 & auVar23);
      auVar27 = packssdw(auVar26 & auVar23,auVar28 & auVar23);
      sVar2 = auVar24._0_2_;
      sVar3 = auVar24._2_2_;
      sVar4 = auVar24._4_2_;
      sVar5 = auVar24._6_2_;
      sVar6 = auVar24._8_2_;
      sVar7 = auVar24._10_2_;
      sVar8 = auVar24._12_2_;
      sVar9 = auVar24._14_2_;
      sVar10 = auVar27._0_2_;
      sVar11 = auVar27._2_2_;
      sVar12 = auVar27._4_2_;
      sVar13 = auVar27._6_2_;
      sVar14 = auVar27._8_2_;
      sVar15 = auVar27._10_2_;
      sVar16 = auVar27._12_2_;
      sVar17 = auVar27._14_2_;
      puVar1 = alpha + uVar20;
      *puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar24[0] - (0xff < sVar2);
      puVar1[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar24[2] - (0xff < sVar3);
      puVar1[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar24[4] - (0xff < sVar4);
      puVar1[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar24[6] - (0xff < sVar5);
      puVar1[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar24[8] - (0xff < sVar6);
      puVar1[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar24[10] - (0xff < sVar7);
      puVar1[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar24[0xc] - (0xff < sVar8);
      puVar1[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar24[0xe] - (0xff < sVar9);
      puVar1[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar27[0] - (0xff < sVar10);
      puVar1[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar27[2] - (0xff < sVar11);
      puVar1[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar27[4] - (0xff < sVar12);
      puVar1[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar27[6] - (0xff < sVar13);
      puVar1[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar27[8] - (0xff < sVar14);
      puVar1[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar27[10] - (0xff < sVar15);
      puVar1[0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar27[0xc] - (0xff < sVar16);
      puVar1[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar27[0xe] - (0xff < sVar17);
      puVar18 = puVar18 + 0x10;
      uVar21 = uVar20 + 0x10;
      uVar22 = uVar20 + 0x20;
      uVar20 = uVar21;
    } while (uVar22 <= (uint)size);
  }
  uVar19 = (uint)uVar21;
  if ((int)(uVar19 | 8) <= size) {
    auVar23._0_4_ = *puVar18 >> 8;
    auVar23._4_4_ = puVar18[1] >> 8;
    auVar23._8_4_ = puVar18[2] >> 8;
    auVar23._12_4_ = puVar18[3] >> 8;
    auVar25._0_4_ = puVar18[4] >> 8;
    auVar25._4_4_ = puVar18[5] >> 8;
    auVar25._8_4_ = puVar18[6] >> 8;
    auVar25._12_4_ = puVar18[7] >> 8;
    auVar23 = packssdw(auVar23 & _DAT_00127480,auVar25 & _DAT_00127480);
    sVar2 = auVar23._0_2_;
    sVar3 = auVar23._2_2_;
    sVar4 = auVar23._4_2_;
    sVar5 = auVar23._6_2_;
    sVar6 = auVar23._8_2_;
    sVar7 = auVar23._10_2_;
    sVar8 = auVar23._12_2_;
    sVar9 = auVar23._14_2_;
    *(ulong *)(alpha + (uVar21 & 0xffffffff)) =
         CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar23[0xe] - (0xff < sVar9),
                  CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar23[0xc] - (0xff < sVar8),
                           CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar23[10] - (0xff < sVar7),
                                    CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar23[8] -
                                             (0xff < sVar6),
                                             CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar23[6] -
                                                      (0xff < sVar5),
                                                      CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                               auVar23[4] - (0xff < sVar4),
                                                               CONCAT11((0 < sVar3) *
                                                                        (sVar3 < 0x100) * auVar23[2]
                                                                        - (0xff < sVar3),
                                                                        (0 < sVar2) *
                                                                        (sVar2 < 0x100) * auVar23[0]
                                                                        - (0xff < sVar2))))))));
    uVar19 = uVar19 | 8;
  }
  if ((int)uVar19 < size) {
    uVar21 = (ulong)uVar19;
    do {
      alpha[uVar21] = *(uint8_t *)((long)argb + uVar21 * 4 + 1);
      uVar21 = uVar21 + 1;
    } while ((uint)size != uVar21);
  }
  return;
}

Assistant:

static void ExtractGreen_SSE2(const uint32_t* WEBP_RESTRICT argb,
                              uint8_t* WEBP_RESTRICT alpha, int size) {
  int i;
  const __m128i mask = _mm_set1_epi32(0xff);
  const __m128i* src = (const __m128i*)argb;

  for (i = 0; i + 16 <= size; i += 16, src += 4) {
    const __m128i a0 = _mm_loadu_si128(src + 0);
    const __m128i a1 = _mm_loadu_si128(src + 1);
    const __m128i a2 = _mm_loadu_si128(src + 2);
    const __m128i a3 = _mm_loadu_si128(src + 3);
    const __m128i b0 = _mm_srli_epi32(a0, 8);
    const __m128i b1 = _mm_srli_epi32(a1, 8);
    const __m128i b2 = _mm_srli_epi32(a2, 8);
    const __m128i b3 = _mm_srli_epi32(a3, 8);
    const __m128i c0 = _mm_and_si128(b0, mask);
    const __m128i c1 = _mm_and_si128(b1, mask);
    const __m128i c2 = _mm_and_si128(b2, mask);
    const __m128i c3 = _mm_and_si128(b3, mask);
    const __m128i d0 = _mm_packs_epi32(c0, c1);
    const __m128i d1 = _mm_packs_epi32(c2, c3);
    const __m128i e = _mm_packus_epi16(d0, d1);
    // store
    _mm_storeu_si128((__m128i*)&alpha[i], e);
  }
  if (i + 8 <= size) {
    const __m128i a0 = _mm_loadu_si128(src + 0);
    const __m128i a1 = _mm_loadu_si128(src + 1);
    const __m128i b0 = _mm_srli_epi32(a0, 8);
    const __m128i b1 = _mm_srli_epi32(a1, 8);
    const __m128i c0 = _mm_and_si128(b0, mask);
    const __m128i c1 = _mm_and_si128(b1, mask);
    const __m128i d = _mm_packs_epi32(c0, c1);
    const __m128i e = _mm_packus_epi16(d, d);
    _mm_storel_epi64((__m128i*)&alpha[i], e);
    i += 8;
  }
  for (; i < size; ++i) alpha[i] = argb[i] >> 8;
}